

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  byte bVar1;
  TValue *pTVar2;
  TRef *pTVar3;
  int iVar4;
  IRRef1 IVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  IRRef1 IVar9;
  ulong uVar10;
  IROpT IVar11;
  IRRef1 IVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int32_t iVar16;
  uint uVar17;
  GCobj *o;
  long lVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint local_40;
  
  bVar1 = J->pt->numparams;
  uVar14 = (ulong)bVar1;
  lVar18 = (long)(*(int *)((long)J->L->base + -4) >> 3);
  uVar21 = ~uVar14 + lVar18;
  if (0 < J->framedepth) {
    uVar14 = 0;
    if (0 < (long)uVar21) {
      uVar14 = uVar21;
    }
    if (nresults == 1) {
      nresults = 1;
      if (dst < J->maxslot) goto LAB_001509c2;
      iVar4 = 1;
    }
    else {
      if (nresults == -1) {
        nresults = uVar14;
      }
      iVar4 = (int)nresults;
    }
    J->maxslot = iVar4 + dst;
LAB_001509c2:
    if (J->maxslot + J->baseslot < 0xfa) {
      if (0 < nresults) {
        uVar15 = 0;
        do {
          TVar6 = 0x7fff;
          if (((long)uVar15 < (long)uVar21) && (TVar6 = J->base[~uVar14 + uVar15], TVar6 == 0)) {
            TVar6 = sload(J,(-1 - (int)uVar14) + (int)uVar15);
          }
          J->base[dst + uVar15] = TVar6;
          uVar15 = uVar15 + 1;
        } while (nresults != uVar15);
      }
      return;
    }
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  (J->fold).ins.field_0.ot = 0x4613;
  (J->fold).ins.field_1.op12 = 0x120000;
  TVar6 = lj_opt_fold(J);
  uVar19 = (uint)bVar1 * 8;
  local_40 = (uint)bVar1 * 8 + 0xb;
  IVar9 = (IRRef1)TVar6;
  if (-1 < nresults) {
    if ((long)uVar21 < 1) {
      TVar6 = lj_ir_kint(J,local_40);
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      uVar21 = 0;
    }
    else {
      if ((long)uVar21 < nresults) {
        iVar16 = *(int32_t *)((long)J->L->base + -4);
        IVar11 = 0x893;
        uVar15 = uVar21;
      }
      else {
        iVar16 = local_40 + (int)nresults * 8;
        IVar11 = 0x193;
        uVar15 = nresults;
      }
      TVar6 = lj_ir_kint(J,iVar16);
      (J->fold).ins.field_0.ot = IVar11;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2a13;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar9;
      TVar6 = lj_opt_fold(J);
      TVar7 = lj_ir_kint(J,uVar19 | 3);
      (J->fold).ins.field_0.ot = 0x2905;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      TVar6 = lj_opt_fold(J);
      if (nresults != 0) {
        uVar10 = 1;
        if (1 < (long)uVar15) {
          uVar10 = uVar15;
        }
        uVar15 = 0;
        do {
          uVar19 = *(uint *)((long)J->L->base + uVar15 * 8 + (uVar14 * 8 + lVar18 * -8 | 4));
          uVar13 = ~uVar19;
          if ((uVar19 & 0xffff8000) == 0xffff0000) {
            uVar13 = 3;
          }
          if (uVar19 < 0xfffeffff) {
            uVar13 = 0xe;
          }
          TVar7 = lj_ir_kint(J,(int32_t)uVar15);
          (J->fold).ins.field_0.ot = 0x3805;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
          TVar7 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)uVar13 | 0x4780;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
          (J->fold).ins.field_0.op2 = 0;
          TVar8 = lj_opt_fold(J);
          TVar7 = uVar13 * 0xffffff + 0x7fff;
          if (2 < uVar13) {
            TVar7 = TVar8;
          }
          J->base[dst + uVar15] = TVar7;
          uVar15 = uVar15 + 1;
        } while (uVar10 != uVar15);
      }
    }
    if ((long)uVar21 < nresults) {
      pTVar3 = J->base;
      do {
        pTVar3[dst + uVar21] = 0x7fff;
        uVar21 = uVar21 + 1;
      } while (nresults != uVar21);
    }
    if ((nresults == 1) && (dst < J->maxslot)) {
      return;
    }
    J->maxslot = (int)nresults + dst;
    return;
  }
  if ((J->pc[1] & 0xffff00ff) != 0x2010041) goto LAB_0015116f;
  pTVar2 = J->L->base;
  uVar13 = J->pc[1] >> 8 & 0xff;
  uVar15 = (ulong)uVar13;
  if ((*(int *)((long)pTVar2 + uVar15 * 8 + 4) != -9) ||
     (o = (GCobj *)(ulong)pTVar2[uVar15].u32.lo, (o->gch).unused1 != '\x10')) goto LAB_0015116f;
  TVar7 = lj_ir_kgc(J,o,IRT_FUNC);
  TVar6 = J->base[uVar15];
  if (TVar6 == 0) {
    TVar6 = sload(J,uVar13);
  }
  (J->fold).ins.field_0.ot = 0x888;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
  lj_opt_fold(J);
  uVar13 = dst - 1;
  TVar6 = J->base[uVar13];
  if (TVar6 == 0) {
    TVar6 = sload(J,uVar13);
  }
  iVar16 = lj_ffrecord_select_mode(J,TVar6,J->L->base + uVar13);
  if (iVar16 < 0) goto LAB_0015116f;
  if ((iVar16 != 0) && (4 < (TVar6 >> 0x18 & 0x1f) - 0xf)) {
    if ((TVar6 & 0x1f000000) == 0x4000000) {
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5c8e0000;
      TVar6 = lj_opt_fold(J);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5993226e;
    TVar6 = lj_opt_fold(J);
  }
  lVar18 = (long)iVar16;
  IVar12 = (IRRef1)TVar6;
  if ((short)IVar12 < 0 || iVar16 == 0) {
    if ((long)uVar21 < lVar18) {
      TVar7 = lj_ir_kint(J,local_40);
      IVar5 = (IRRef1)TVar7;
      if (iVar16 == 0) {
        TVar7 = lj_ir_kint(J,0);
      }
      else {
        TVar7 = lj_ir_kint(J,3);
        (J->fold).ins.field_0.ot = 0x2413;
        (J->fold).ins.field_0.op1 = IVar12;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar7 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
        (J->fold).ins.field_0.op2 = IVar5;
        TVar7 = lj_opt_fold(J);
        IVar5 = (IRRef1)TVar7;
        TVar7 = 0x7fff;
      }
      (J->fold).ins.field_0.ot = 0x93;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = IVar5;
      lj_opt_fold(J);
    }
    else {
      TVar6 = lj_ir_kint(J,(uint)bVar1 * -8 + -0xb);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      TVar6 = lj_opt_fold(J);
      if (uVar14 != 0) {
        TVar7 = lj_ir_kint(J,0);
        (J->fold).ins.field_0.ot = 0x193;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        lj_opt_fold(J);
      }
      TVar7 = lj_ir_kint(J,3);
      (J->fold).ins.field_0.ot = 0x2513;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      TVar7 = lj_opt_fold(J);
      if (iVar16 == 0) goto LAB_0015102a;
      TVar6 = lj_ir_kint(J,-1);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = IVar12;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      TVar6 = lj_opt_fold(J);
      rec_idx_abc(J,TVar7,TVar6,(uint32_t)uVar21);
    }
    IVar12 = (IRRef1)TVar6;
  }
  else {
    TVar6 = lj_ir_kint(J,local_40 + iVar16 * 8);
    (J->fold).ins.field_0.ot = (ushort)(lVar18 <= (long)uVar21) << 8 | 0x93;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
    local_40 = uVar19 | 3;
    TVar7 = 0x7fff;
  }
LAB_0015102a:
  if ((iVar16 != 0) && (lVar18 - uVar21 == 0 || lVar18 < (long)uVar21)) {
    (J->fold).ins.field_0.ot = 0x2a13;
    (J->fold).ins.field_0.op1 = 0x8000;
    (J->fold).ins.field_0.op2 = IVar9;
    TVar6 = lj_opt_fold(J);
    TVar7 = lj_ir_kint(J,local_40 - 8);
    (J->fold).ins.field_0.ot = 0x2905;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar6 = lj_opt_fold(J);
    uVar19 = *(uint *)((long)J->L->base + (lVar18 - uVar21) * 8 + -0xc);
    uVar17 = 3;
    if ((uVar19 & 0xffff8000) != 0xffff0000) {
      uVar17 = ~uVar19;
    }
    uVar20 = 0xe;
    if (0xfffefffe < uVar19) {
      uVar20 = uVar17;
    }
    (J->fold).ins.field_0.ot = 0x3805;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar12;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = (ushort)uVar20 | 0x4780;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = 0;
    TVar6 = lj_opt_fold(J);
    TVar7 = uVar20 * 0xffffff + 0x7fff;
    if (2 < uVar20) {
      TVar7 = TVar6;
    }
  }
  J->base[dst - 2] = TVar7;
  J->maxslot = uVar13;
  J->bcskip = '\x02';
  if (-1 < iVar16) {
    return;
  }
LAB_0015116f:
  (J->errinfo).u64 = 0x4051c00000000000;
  lj_trace_err_info(J,LJ_TRERR_NYIBC);
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1 - LJ_FR2;
  lj_assertJ(frame_isvarg(J->L->base-1), "VARG in non-vararg frame");
  if (LJ_FR2 && dst > J->maxslot)
    J->base[dst-1] = 0;  /* Prevent resurrection of unrelated slot. */
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults != 1) {
      if (nresults == -1) nresults = nvararg;
      J->maxslot = dst + (BCReg)nresults;
    } else if (dst >= J->maxslot) {
      J->maxslot = dst + 1;
    }
    if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
      lj_trace_err(J, LJ_TRERR_STACKOV);
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1 - LJ_FR2) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), LJ_FR2, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+LJ_FR2+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr,
		 lj_ir_kint(J, (int32_t)frame_ftsz(J->L->base-1)));
	vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase, lj_ir_kint(J, frofs-8*(1+LJ_FR2)));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-LJ_FR2-nvararg]);
	  TRef aref = emitir(IRT(IR_AREF, IRT_PGC),
			     vbase, lj_ir_kint(J, (int32_t)i));
	  TRef tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	  if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
	  J->base[dst+i] = tr;
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (nresults != 1 || dst >= J->maxslot) {
	J->maxslot = dst + (BCReg)nresults;
      }
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = getslot(J, dst-1);
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx)) {
	if (tref_isstr(tridx))
	  tridx = emitir(IRTG(IR_STRTO, IRT_NUM), tridx, 0);
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      }
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase,
		       lj_ir_kint(J, frofs-(8<<LJ_FR2)));
	t = itype2irt(&J->L->base[idx-2-LJ_FR2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_PGC), vbase, tridx);
	tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
      }
      J->base[dst-2-LJ_FR2] = tr;
      J->maxslot = dst-1-LJ_FR2;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
}